

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_posix_file_storage.cpp
# Opt level: O3

void __thiscall
cppcms::sessions::session_file_storage::locked_file::locked_file
          (locked_file *this,session_file_storage *object,string *sid,bool create)

{
  pointer pcVar1;
  char *__file;
  int iVar2;
  int iVar3;
  pthread_mutex_t *__mutex;
  int *piVar4;
  stat s_id;
  stat s_name;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  stat local_150;
  stat local_c0;
  
  this->object_ = object;
  (this->sid_)._M_dataplus._M_p = (pointer)&(this->sid_).field_2;
  pcVar1 = (sid->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->sid_,pcVar1,pcVar1 + sid->_M_string_length);
  this->fd_ = -1;
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  (this->name_)._M_string_length = 0;
  (this->name_).field_2._M_local_buf[0] = '\0';
  file_name((string *)&local_150,this->object_,sid);
  std::__cxx11::string::operator=((string *)&this->name_,(string *)&local_150);
  if ((__nlink_t *)local_150.st_dev != &local_150.st_nlink) {
    operator_delete((void *)local_150.st_dev);
  }
  __mutex = sid_to_pos(this->object_,&this->sid_);
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  do {
    __file = (this->name_)._M_dataplus._M_p;
    if (create) {
      iVar2 = open(__file,0x42,0x1b6);
    }
    else {
      iVar2 = open(__file,2);
    }
    this->fd_ = iVar2;
    if (iVar2 < 0) {
      return;
    }
    if (this->object_->file_lock_ != true) {
      return;
    }
    uStack_170 = 0;
    local_168 = 0;
    uStack_160 = 0;
    local_178 = 1;
    do {
      iVar2 = fcntl(this->fd_,7,&local_178);
      if (iVar2 == 0) goto LAB_0023c6b0;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    if (iVar2 < 0) {
      close(this->fd_);
      this->fd_ = -1;
    }
LAB_0023c6b0:
    iVar3 = stat((this->name_)._M_dataplus._M_p,&local_c0);
    iVar2 = this->fd_;
    if (-1 < iVar3) {
      iVar2 = fstat(iVar2,&local_150);
      if (iVar2 < 0) {
        close(this->fd_);
        this->fd_ = -1;
        return;
      }
      if ((local_150.st_ino == local_c0.st_ino) && (local_150.st_dev == local_c0.st_dev)) {
        return;
      }
      iVar2 = this->fd_;
    }
    close(iVar2);
    this->fd_ = -1;
  } while( true );
}

Assistant:

locked_file(session_file_storage *object,std::string sid,bool create) :
		object_(object),
		sid_(sid),
		fd_(-1)
	{
		name_=object_->file_name(sid);
		object_->lock(sid_);
		for(;;) {
			if(create)
				fd_=::open(name_.c_str(),O_CREAT | O_RDWR,0666);
			else
				fd_=::open(name_.c_str(),O_RDWR);

			if(fd_ < 0) return;

			if(!object_->file_lock_)
				return;

			struct flock lock;
			memset(&lock,0,sizeof(lock));
			lock.l_type=F_WRLCK;
			lock.l_whence=SEEK_SET;
			int res;
			while((res=fcntl(fd_,F_SETLKW,&lock))!=0 && errno==EINTR)
				;
			if(res < 0) {
				::close(fd_);
				fd_=-1;
			}
			struct stat s_id,s_name;
			if(::stat(name_.c_str(),&s_name) < 0) {
				// looks like file was deleted
				::close(fd_);
				fd_=-1;
				continue;
			}
			if(::fstat(fd_,&s_id) < 0) {
				::close(fd_);
				fd_=-1;
				return;
			}
			if(s_id.st_ino!=s_name.st_ino || s_id.st_dev!=s_name.st_dev) {
				::close(fd_);
				fd_=-1;
				continue;
			}
			return;
		}

	}